

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall
edition_unittest::TestVerifyBigFieldNumberUint32_Nested::Clear
          (TestVerifyBigFieldNumberUint32_Nested *this)

{
  TestVerifyBigFieldNumberUint32_Nested *this_00;
  anon_union_72_1_493b367e_for_TestVerifyBigFieldNumberUint32_Nested_3 aVar1;
  LogMessageFatal local_20;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestVerifyBigFieldNumberUint32_Nested>>
            (&(this->field_0)._impl_.repeated_nested_.super_RepeatedPtrFieldBase);
  aVar1 = this->field_0;
  if (((undefined1  [72])aVar1 & (undefined1  [72])0x1) != (undefined1  [72])0x0) {
    this_00 = (this->field_0)._impl_.optional_nested_;
    if (this_00 == (TestVerifyBigFieldNumberUint32_Nested *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/edition_unittest.pb.cc"
                 ,0xcb85,"_impl_.optional_nested_ != nullptr");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
    }
    Clear(this_00);
  }
  if (((undefined1  [72])aVar1 & (undefined1  [72])0xfe) != (undefined1  [72])0x0) {
    *(undefined8 *)((long)&this->field_0 + 0x34) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x3c) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x28) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x30) = 0;
  }
  (this->field_0)._impl_.optional_uint32_5000_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestVerifyBigFieldNumberUint32_Nested::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestVerifyBigFieldNumberUint32.Nested)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_nested_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    ABSL_DCHECK(_impl_.optional_nested_ != nullptr);
    _impl_.optional_nested_->Clear();
  }
  if ((cached_has_bits & 0x000000feu) != 0) {
    ::memset(&_impl_.optional_uint32_1_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.optional_uint32_1000_) -
        reinterpret_cast<char*>(&_impl_.optional_uint32_1_)) + sizeof(_impl_.optional_uint32_1000_));
  }
  _impl_.optional_uint32_5000_ = 0u;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}